

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::InterInvocationTestCase::iterate
          (InterInvocationTestCase *this)

{
  pointer *ppiVar1;
  TestContext *this_00;
  ulong uVar2;
  ulong uVar3;
  char cVar4;
  int iVar5;
  deUint32 dVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  void *__src;
  long *plVar7;
  TestError *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  long lVar9;
  char *pcVar10;
  bool bVar11;
  vector<int,_std::allocator<int>_> results;
  vector<int,_std::allocator<int>_> local_1d0;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [6];
  ios_base local_138 [264];
  
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar5);
  uVar2 = (long)this->m_workWidth / (long)this->m_localWidth;
  uVar3 = (long)this->m_workHeight / (long)this->m_localHeight;
  local_1b0 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"Dispatching compute.\n",0x15);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\tgroup size: ",0xd);
  std::ostream::operator<<((ostringstream *)&local_1a8,this->m_localWidth);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"x",1);
  std::ostream::operator<<((ostringstream *)&local_1a8,this->m_localHeight);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\tdispatch size: ",0x10)
  ;
  std::ostream::operator<<((ostringstream *)&local_1a8,(int)uVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"x",1);
  std::ostream::operator<<((ostringstream *)&local_1a8,(int)uVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"\ttotal work size: ",0x12);
  std::ostream::operator<<((ostringstream *)&local_1a8,this->m_workWidth);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"x",1);
  std::ostream::operator<<((ostringstream *)&local_1a8,this->m_workHeight);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  (**(code **)(lVar9 + 0x1680))((this->m_program->m_program).m_program);
  if (this->m_storage == STORAGE_IMAGE) {
    bVar11 = this->m_aliasingStorages;
    (**(code **)(lVar9 + 0x80))(1,this->m_storageTex,0,0,0,0x88ba,0x8235);
    if (bVar11 == false) {
      dVar6 = (**(code **)(lVar9 + 0x800))();
      pcVar10 = "bind result buf";
      iVar5 = 0x160;
LAB_014c5641:
      glu::checkError(dVar6,pcVar10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                      ,iVar5);
      goto LAB_014c5646;
    }
    (**(code **)(lVar9 + 0x80))(2,this->m_storageTex,0,0,0,0x88ba,0x8235);
    dVar6 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar6,"bind result buf",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                    ,0x167);
    local_1b0 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"Binding same texture level to image storages.",0x2d);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    if (this->m_storage != STORAGE_BUFFER) goto LAB_014c5646;
    bVar11 = this->m_aliasingStorages;
    (**(code **)(lVar9 + 0x48))(0x90d2,1,this->m_storageBuf);
    if (bVar11 == false) {
      dVar6 = (**(code **)(lVar9 + 0x800))();
      pcVar10 = "bind source buf";
      iVar5 = 0x153;
      goto LAB_014c5641;
    }
    (**(code **)(lVar9 + 0x48))(0x90d2,2,this->m_storageBuf);
    dVar6 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar6,"bind source buf",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                    ,0x159);
    local_1b0 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"Binding same buffer object to buffer storages.",0x2e);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
LAB_014c5646:
  (**(code **)(lVar9 + 0x48))(0x90d2,0,this->m_resultBuf);
  dVar6 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar6,"bind result buf",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                  ,0x170);
  (**(code **)(lVar9 + 0x528))(uVar2 & 0xffffffff,uVar3 & 0xffffffff,1);
  dVar6 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar6,"dispatchCompute",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                  ,0x174);
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var_00,iVar5);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_1d0,(long)(this->m_workHeight * this->m_workWidth),(allocator_type *)local_1b0);
  (**(code **)(lVar9 + 0x40))(0x90d2,this->m_resultBuf);
  __src = (void *)(**(code **)(lVar9 + 0xd00))
                            (0x90d2,0,(long)(this->m_workHeight * this->m_workWidth) << 2,1);
  dVar6 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar6,"map buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                  ,0x182);
  memcpy(local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start,__src,(long)(this->m_workHeight * this->m_workWidth) << 2);
  cVar4 = (**(code **)(lVar9 + 0x1670))(0x90d2);
  if (cVar4 != '\x01') {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    local_1b0 = (undefined1  [8])local_1a0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,"memory map store corrupted","");
    tcu::TestError::TestError(this_01,(string *)local_1b0);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  if ((int)((ulong)((long)local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 2) < 1) {
LAB_014c58ea:
    local_1b0 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"Result buffer ok.",0x11);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
    bVar11 = true;
  }
  else {
    lVar9 = 0;
    bVar11 = false;
    iVar5 = 0;
    do {
      while (local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start[lVar9] == 1) {
        lVar9 = lVar9 + 1;
        if ((int)((ulong)((long)local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 2) <= lVar9) {
          if (!bVar11) goto LAB_014c58ea;
          goto LAB_014c58e6;
        }
      }
      if (iVar5 == 0) {
        local_1b0 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"Result buffer failed, got unexpected values.\n",0x2d);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        iVar5 = 1;
      }
      else {
        if (4 < iVar5) {
          local_1b0 = (undefined1  [8])
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,"\t-- too many errors, skipping verification --\n",0x2e);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
          std::ios_base::~ios_base(local_138);
          break;
        }
        iVar5 = iVar5 + 1;
      }
      local_1b0 = (undefined1  [8])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,"\tError at index ",0x10);
      std::ostream::operator<<((ostringstream *)&local_1a8,(int)lVar9);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,": expected 1, got ",0x12);
      std::ostream::operator<<
                ((ostringstream *)&local_1a8,
                 local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar9]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,".\n",2);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
      lVar9 = lVar9 + 1;
      bVar11 = true;
    } while (lVar9 < (int)((ulong)((long)local_1d0.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_1d0.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start) >> 2));
LAB_014c58e6:
    bVar11 = false;
  }
  if (local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
  if (bVar11) {
    tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,"Pass");
  }
  else {
    bVar11 = this->m_storage == STORAGE_BUFFER;
    pcVar10 = "image";
    if (bVar11) {
      pcVar10 = "buffer";
    }
    ppiVar1 = &local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)ppiVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1d0,pcVar10,pcVar10 + (ulong)bVar11 + 5);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_1d0);
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 == paVar8) {
      local_1a0[0]._0_8_ = paVar8->_M_allocated_capacity;
      local_1a0[0]._8_8_ = plVar7[3];
      local_1b0 = (undefined1  [8])local_1a0;
    }
    else {
      local_1a0[0]._0_8_ = paVar8->_M_allocated_capacity;
      local_1b0 = (undefined1  [8])*plVar7;
    }
    local_1a8 = (_func_int **)plVar7[1];
    *plVar7 = (long)paVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_FAIL,(char *)local_1b0);
    if (local_1b0 != (undefined1  [8])local_1a0) {
      operator_delete((void *)local_1b0,local_1a0[0]._M_allocated_capacity + 1);
    }
    if ((pointer *)
        local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != ppiVar1) {
      operator_delete(local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 1);
    }
  }
  return STOP;
}

Assistant:

InterInvocationTestCase::IterateResult InterInvocationTestCase::iterate (void)
{
	// Dispatch
	runCompute();

	// Verify buffer contents
	if (verifyResults())
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, (std::string((m_storage == STORAGE_BUFFER) ? ("buffer") : ("image")) + " content verification failed").c_str());

	return STOP;
}